

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  Finder *pFVar3;
  string **ppsVar4;
  char *pcVar5;
  ushort *puVar6;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> __n;
  pointer __n_00;
  int32_t number;
  size_type __n_01;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExtensionRange *pEVar11;
  undefined4 extraout_var_01;
  Descriptor *pDVar12;
  Descriptor *pDVar13;
  ReservedRange *pRVar14;
  FieldDescriptor *pFVar15;
  MessageFactory *factory;
  MessageLite *this_00;
  Nonnull<const_char_*> pcVar16;
  ulong uVar17;
  size_type __rlen;
  _Alloc_hider _Var18;
  _Alloc_hider in_R8;
  OneofDescriptor *oneof_descriptor;
  ulong uVar19;
  Metadata MVar20;
  string_view printable_name;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_02;
  string_view text;
  string_view name;
  string_view name_00;
  string_view lowercase_name;
  string_view data;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  FieldDescriptor *field;
  Message *local_280;
  Reflection *local_278;
  int32_t val;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  undefined8 local_250;
  char *local_248;
  ulong local_240;
  char *local_238;
  undefined8 local_230;
  char *local_228;
  undefined1 local_220 [16];
  undefined1 local_210 [32];
  string field_name;
  string prefix_and_full_type_name;
  string full_type_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  string serialized_value;
  string local_138;
  string local_118;
  int start_column;
  int start_line;
  string prefix;
  string local_c0;
  string local_a0;
  anon_class_32_4_2c58ab61 skip_parsing;
  AlphaNum local_60;
  undefined4 extraout_var_02;
  
  MVar20 = Message::GetMetadata(message);
  local_278 = MVar20.reflection;
  MVar20 = Message::GetMetadata(message);
  pDVar13 = MVar20.descriptor;
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  field = (FieldDescriptor *)0x0;
  start_line = (this->tokenizer_).current_.line;
  skip_parsing.start_line = &start_line;
  start_column = (this->tokenizer_).current_.column;
  skip_parsing.start_column = &start_column;
  local_280 = message;
  skip_parsing.this = this;
  skip_parsing.field = &field;
  bVar7 = internal::GetAnyFieldDescriptors(message,&any_type_url_field,&any_value_field);
  if (bVar7) {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"[","");
    bVar7 = TryConsume(this,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar7 = false;
  }
  if (bVar7 != false) {
    full_type_name._M_string_length = 0;
    full_type_name.field_2._M_local_buf[0] = '\0';
    prefix._M_string_length = 0;
    prefix.field_2._M_local_buf[0] = '\0';
    full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    bVar7 = ConsumeAnyTypeUrl(this,&full_type_name,&prefix);
    if (bVar7) {
      _val = (pointer)prefix._M_string_length;
      local_268._M_head_impl = (LogMessageData *)prefix._M_dataplus._M_p;
      local_220._0_8_ = full_type_name._M_string_length;
      local_220._8_8_ = full_type_name._M_dataplus._M_p;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&prefix_and_full_type_name,(lts_20250127 *)&val,(AlphaNum *)local_220,
                 (AlphaNum *)full_type_name._M_string_length);
      _val = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
      bVar7 = ConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_260) {
        operator_delete(_val,local_260._M_allocated_capacity + 1);
      }
      if (bVar7) {
        TryConsumeWhitespace(this);
        _val = (pointer)&local_260;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
        bVar7 = TryConsumeBeforeWhitespace(this,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_260) {
          operator_delete(_val,local_260._M_allocated_capacity + 1);
        }
        if (bVar7) {
          TryConsumeWhitespace(this);
        }
        paVar1 = &serialized_value.field_2;
        serialized_value._M_string_length = 0;
        serialized_value.field_2._M_local_buf[0] = '\0';
        pFVar3 = this->finder_;
        serialized_value._M_dataplus._M_p = (pointer)paVar1;
        if (pFVar3 == (Finder *)0x0) {
          pDVar13 = anon_unknown_14::DefaultFinderFindAnyType(local_280,&prefix,&full_type_name);
        }
        else {
          iVar10 = (*pFVar3->_vptr_Finder[4])(pFVar3,local_280,&prefix,&full_type_name);
          pDVar13 = (Descriptor *)CONCAT44(extraout_var,iVar10);
        }
        if (pDVar13 == (Descriptor *)0x0) {
          _val = (pointer)0x15;
          local_268._M_head_impl = (LogMessageData *)0x467eb1;
          local_220._0_8_ = prefix_and_full_type_name._M_string_length;
          local_220._8_8_ = prefix_and_full_type_name._M_dataplus._M_p;
          local_60.piece_._M_len = 0x20;
          local_60.piece_._M_str = "\" stored in google.protobuf.Any.";
          absl::lts_20250127::StrCat_abi_cxx11_
                    (&local_c0,(lts_20250127 *)&val,(AlphaNum *)local_220,&local_60,
                     (AlphaNum *)in_R8._M_p);
          message_01._M_str = local_c0._M_dataplus._M_p;
          message_01._M_len = local_c0._M_string_length;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_01);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
LAB_002bdbb5:
          bVar7 = false;
        }
        else {
          bVar7 = ConsumeAnyValue(this,pDVar13,&serialized_value);
          if (!bVar7) goto LAB_002bdbb5;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((bVar7 = FieldDescriptor::is_repeated(any_type_url_field), !bVar7 &&
               (bVar7 = Reflection::HasField(local_278,local_280,any_type_url_field), bVar7)) ||
              ((bVar7 = FieldDescriptor::is_repeated(any_value_field), !bVar7 &&
               (bVar7 = Reflection::HasField(local_278,local_280,any_value_field), bVar7)))))) {
            message_00._M_str = "Non-repeated Any specified multiple times.";
            message_00._M_len = 0x2a;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_00);
            goto LAB_002bdbb5;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)prefix_and_full_type_name._M_dataplus._M_p == &prefix_and_full_type_name.field_2) {
            local_118.field_2._8_8_ = prefix_and_full_type_name.field_2._8_8_;
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118._M_dataplus._M_p = prefix_and_full_type_name._M_dataplus._M_p;
          }
          local_118.field_2._M_allocated_capacity._1_7_ =
               prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_;
          local_118.field_2._M_local_buf[0] = prefix_and_full_type_name.field_2._M_local_buf[0];
          local_118._M_string_length = prefix_and_full_type_name._M_string_length;
          prefix_and_full_type_name._M_string_length = 0;
          prefix_and_full_type_name.field_2._M_local_buf[0] = '\0';
          prefix_and_full_type_name._M_dataplus._M_p = (pointer)&prefix_and_full_type_name.field_2;
          Reflection::SetString(local_278,local_280,any_type_url_field,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)serialized_value._M_dataplus._M_p == paVar1) {
            local_138.field_2._8_8_ = serialized_value.field_2._8_8_;
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
          }
          else {
            local_138._M_dataplus._M_p = serialized_value._M_dataplus._M_p;
          }
          local_138.field_2._M_allocated_capacity._1_7_ =
               serialized_value.field_2._M_allocated_capacity._1_7_;
          local_138.field_2._M_local_buf[0] = serialized_value.field_2._M_local_buf[0];
          local_138._M_string_length = serialized_value._M_string_length;
          serialized_value._M_string_length = 0;
          serialized_value.field_2._M_local_buf[0] = '\0';
          serialized_value._M_dataplus._M_p = (pointer)paVar1;
          Reflection::SetString(local_278,local_280,any_value_field,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          bVar7 = ConsumeField::anon_class_32_4_2c58ab61::operator()(&skip_parsing,true);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)serialized_value._M_dataplus._M_p != paVar1) {
          operator_delete(serialized_value._M_dataplus._M_p,
                          CONCAT71(serialized_value.field_2._M_allocated_capacity._1_7_,
                                   serialized_value.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        bVar7 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)prefix_and_full_type_name._M_dataplus._M_p != &prefix_and_full_type_name.field_2) {
        operator_delete(prefix_and_full_type_name._M_dataplus._M_p,
                        CONCAT71(prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_,
                                 prefix_and_full_type_name.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      bVar7 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p,
                      CONCAT71(prefix.field_2._M_allocated_capacity._1_7_,
                               prefix.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
      operator_delete(full_type_name._M_dataplus._M_p,
                      CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                               full_type_name.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_002be8bf;
  }
  _val = (pointer)&local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
  bVar7 = TryConsume(this,(string *)&val);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_val != &local_260) {
    operator_delete(_val,local_260._M_allocated_capacity + 1);
  }
  if (bVar7) {
    bVar7 = ConsumeFullTypeName(this,&field_name);
    if (bVar7) {
      _val = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
      bVar7 = ConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_260) {
        operator_delete(_val,local_260._M_allocated_capacity + 1);
      }
      if (bVar7) {
        TryConsumeWhitespace(this);
        pFVar3 = this->finder_;
        if (pFVar3 == (Finder *)0x0) {
          MVar20 = Message::GetMetadata(local_280);
          printable_name._M_str = field_name._M_dataplus._M_p;
          printable_name._M_len = field_name._M_string_length;
          field = DescriptorPool::FindExtensionByPrintableName
                            ((MVar20.descriptor)->file_->pool_,MVar20.descriptor,printable_name);
        }
        else {
          iVar10 = (*pFVar3->_vptr_Finder[2])(pFVar3,local_280,&field_name);
          field = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar10);
        }
        if (field == (FieldDescriptor *)0x0) {
          if ((this->allow_unknown_field_ != false) || (this->allow_unknown_extension_ != false)) {
            local_238 = (pDVar13->all_names_).payload_;
            local_240 = (ulong)*(ushort *)(local_238 + 2);
            _val = (pointer)0x14;
            local_268._M_head_impl = (LogMessageData *)0x467f4c;
            local_260._M_allocated_capacity = field_name._M_string_length;
            local_260._8_8_ = field_name._M_dataplus._M_p;
            local_250 = 0x32;
            local_248 = "\" which is not defined or is not an extension of \"";
            local_238 = local_238 + ~local_240;
            local_230 = 2;
            local_228 = "\".";
            pieces._M_len = field_name._M_string_length;
            pieces._M_array = (iterator)&DAT_00000005;
            absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                      ((string *)local_220,(strings_internal *)&val,pieces);
            message_02._M_str = (char *)local_220._0_8_;
            message_02._M_len = local_220._8_8_;
            in_R8._M_p = (pointer)local_220._0_8_;
            ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                          message_02);
            if ((AlphaNum *)local_220._0_8_ != (AlphaNum *)local_210) {
              operator_delete((void *)local_220._0_8_,local_210._0_8_ + 1);
            }
            goto LAB_002bdcfd;
          }
          local_238 = (pDVar13->all_names_).payload_;
          local_240 = (ulong)*(ushort *)(local_238 + 2);
          _val = (pointer)0xb;
          local_268._M_head_impl = (LogMessageData *)0x467f13;
          local_260._M_allocated_capacity = field_name._M_string_length;
          local_260._8_8_ = field_name._M_dataplus._M_p;
          local_250 = 0x2c;
          local_248 = "\" is not defined or is not an extension of \"";
          local_238 = local_238 + ~local_240;
          local_230 = 2;
          local_228 = "\".";
          pieces_02._M_len = field_name._M_string_length;
          pieces_02._M_array = (iterator)&DAT_00000005;
          absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                    ((string *)local_220,(strings_internal *)&val,pieces_02);
          message_08._M_str = (char *)local_220._0_8_;
          message_08._M_len = local_220._8_8_;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_08);
          goto LAB_002be8a2;
        }
LAB_002bdcfd:
        bVar7 = false;
        goto LAB_002bdfab;
      }
    }
    goto LAB_002be8bd;
  }
  bVar7 = ConsumeIdentifierBeforeWhitespace(this,&field_name);
  if (!bVar7) goto LAB_002be8bd;
  TryConsumeWhitespace(this);
  if ((this->allow_field_number_ == true) &&
     (text._M_str = (char *)&val, text._M_len = (size_t)field_name._M_dataplus._M_p,
     bVar7 = absl::lts_20250127::numbers_internal::safe_strto32_base
                       ((numbers_internal *)field_name._M_string_length,text,(Nonnull<int32_t_*>)0xa
                        ,(int)in_R8._M_p), _Var18._M_p = _val, bVar7)) {
    number = val;
    pEVar11 = Descriptor::FindExtensionRangeContainingNumber(pDVar13,val);
    if (pEVar11 == (ExtensionRange *)0x0) {
      pRVar14 = Descriptor::FindReservedRangeContainingNumber(pDVar13,number);
      bVar7 = true;
      if (pRVar14 != (ReservedRange *)0x0) goto LAB_002bdedc;
      field = Descriptor::FindFieldByNumber(pDVar13,number);
    }
    else {
      pFVar3 = this->finder_;
      if (pFVar3 == (Finder *)0x0) {
        field = DescriptorPool::FindExtensionByNumber(pDVar13->file_->pool_,pDVar13,number);
      }
      else {
        iVar10 = (*pFVar3->_vptr_Finder[3])(pFVar3,pDVar13,(ulong)_Var18._M_p & 0xffffffff);
        field = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar10);
      }
    }
LAB_002bded9:
    bVar7 = false;
  }
  else {
    name._M_str = field_name._M_dataplus._M_p;
    name._M_len = field_name._M_string_length;
    field = Descriptor::FindFieldByName(pDVar13,name);
    if (field == (FieldDescriptor *)0x0) {
      _val = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&val,field_name._M_dataplus._M_p,
                 field_name._M_dataplus._M_p + field_name._M_string_length);
      absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)&val);
      name_00._M_str = _val;
      name_00._M_len = (size_t)local_268._M_head_impl;
      field = Descriptor::FindFieldByName(pDVar13,name_00);
      if ((field != (FieldDescriptor *)0x0) && (bVar7 = internal::cpp::IsGroupLike(field), !bVar7))
      {
        field = (FieldDescriptor *)0x0;
      }
      if (field != (FieldDescriptor *)0x0) {
        pDVar12 = FieldDescriptor::message_type(field);
        puVar6 = (ushort *)(pDVar12->all_names_).payload_;
        uVar19 = (ulong)*puVar6;
        if ((field_name._M_string_length != uVar19) ||
           ((uVar19 != 0 &&
            (iVar10 = bcmp((void *)((long)puVar6 + ~uVar19),field_name._M_dataplus._M_p,uVar19),
            iVar10 != 0)))) {
          field = (FieldDescriptor *)0x0;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_260) {
        operator_delete(_val,local_260._M_allocated_capacity + 1);
      }
    }
    if ((field == (FieldDescriptor *)0x0) && (this->allow_case_insensitive_field_ == true)) {
      _val = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&val,field_name._M_dataplus._M_p,
                 field_name._M_dataplus._M_p + field_name._M_string_length);
      absl::lts_20250127::AsciiStrToLower((Nonnull<std::string_*>)&val);
      lowercase_name._M_str = _val;
      lowercase_name._M_len = (size_t)local_268._M_head_impl;
      field = Descriptor::FindFieldByLowercaseName(pDVar13,lowercase_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_260) {
        operator_delete(_val,local_260._M_allocated_capacity + 1);
      }
    }
    __n_01 = field_name._M_string_length;
    _Var18._M_p = field_name._M_dataplus._M_p;
    if (field != (FieldDescriptor *)0x0) goto LAB_002bded9;
    uVar19 = (ulong)pDVar13->reserved_name_count_;
    bVar7 = 0 < (long)uVar19;
    if (0 < (long)uVar19) {
      ppsVar4 = pDVar13->reserved_names_;
      bVar7 = true;
      uVar17 = 1;
      do {
        if ((ppsVar4[uVar17 - 1]->_M_string_length == __n_01) &&
           ((__n_01 == 0 ||
            (iVar10 = bcmp(_Var18._M_p,(ppsVar4[uVar17 - 1]->_M_dataplus)._M_p,__n_01), iVar10 == 0)
            ))) break;
        bVar7 = uVar17 < uVar19;
        bVar9 = uVar17 != uVar19;
        uVar17 = uVar17 + 1;
      } while (bVar9);
    }
  }
LAB_002bdedc:
  if ((field == (FieldDescriptor *)0x0) && (!bVar7)) {
    if (this->allow_unknown_field_ != false) {
      pcVar5 = (pDVar13->all_names_).payload_;
      local_260._M_allocated_capacity = (size_type)*(ushort *)(pcVar5 + 2);
      _val = (pointer)0xe;
      local_268._M_head_impl = (LogMessageData *)0x467f94;
      local_260._8_8_ = pcVar5 + ~local_260._M_allocated_capacity;
      local_250 = 0x16;
      local_248 = "\" has no field named \"";
      local_240 = field_name._M_string_length;
      local_238 = field_name._M_dataplus._M_p;
      local_230 = 2;
      local_228 = "\".";
      pieces_00._M_len = (size_type)"\" has no field named \"";
      pieces_00._M_array = (iterator)&DAT_00000005;
      absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                ((string *)local_220,(strings_internal *)&val,pieces_00);
      message_03._M_str = (char *)local_220._0_8_;
      message_03._M_len = local_220._8_8_;
      in_R8._M_p = (pointer)local_220._0_8_;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_03);
      if ((AlphaNum *)local_220._0_8_ != (AlphaNum *)local_210) {
        operator_delete((void *)local_220._0_8_,local_210._0_8_ + 1);
      }
      goto LAB_002bdfab;
    }
    pcVar5 = (pDVar13->all_names_).payload_;
    local_260._M_allocated_capacity = (size_type)*(ushort *)(pcVar5 + 2);
    _val = (pointer)0xe;
    local_268._M_head_impl = (LogMessageData *)0x467f94;
    local_260._8_8_ = pcVar5 + ~local_260._M_allocated_capacity;
    local_250 = 0x16;
    local_248 = "\" has no field named \"";
    local_240 = field_name._M_string_length;
    local_238 = field_name._M_dataplus._M_p;
    local_230 = 2;
    local_228 = "\".";
    pieces_01._M_len = (size_type)"\" has no field named \"";
    pieces_01._M_array = (iterator)&DAT_00000005;
    absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
              ((string *)local_220,(strings_internal *)&val,pieces_01);
    message_07._M_str = (char *)local_220._0_8_;
    message_07._M_len = local_220._8_8_;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message_07)
    ;
LAB_002be8a2:
    _Var18._M_p = (pointer)local_220._0_8_;
    if ((AlphaNum *)local_220._0_8_ == (AlphaNum *)local_210) goto LAB_002be8bd;
    goto LAB_002be8b5;
  }
LAB_002bdfab:
  if (field == (FieldDescriptor *)0x0) {
    if ((this->allow_unknown_field_ == false) && (this->allow_unknown_extension_ == false)) {
      bVar7 = (bool)(bVar7 ^ 1);
    }
    else {
      bVar7 = false;
    }
    if ((bVar7) &&
       (absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_60,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                   ,0x261,"allow_unknown_field_ || allow_unknown_extension_ || reserved_field"),
       bVar7)) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    }
    _val = (pointer)&local_260;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
    bVar7 = TryConsumeBeforeWhitespace(this,(string *)&val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_260) {
      operator_delete(_val,local_260._M_allocated_capacity + 1);
    }
    if (bVar7) {
      TryConsumeWhitespace(this);
      _val = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"{","");
      __n._M_head_impl = (LogMessageData *)(this->tokenizer_).current_.text._M_string_length;
      if (__n._M_head_impl == local_268._M_head_impl) {
        if (__n._M_head_impl == (LogMessageData *)0x0) {
          bVar7 = true;
        }
        else {
          iVar10 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,_val,
                        (size_t)__n._M_head_impl);
          bVar7 = iVar10 == 0;
        }
      }
      else {
        bVar7 = false;
      }
      if (bVar7) {
LAB_002be759:
        bVar9 = false;
      }
      else {
        local_220._0_8_ = local_210;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"<","");
        __n_00 = (pointer)(this->tokenizer_).current_.text._M_string_length;
        bVar9 = true;
        if (__n_00 == (pointer)local_220._8_8_) {
          if (__n_00 == (pointer)0x0) goto LAB_002be759;
          iVar10 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_220._0_8_,
                        (size_t)__n_00);
          bVar9 = iVar10 != 0;
        }
      }
      if ((!bVar7) && ((AlphaNum *)local_220._0_8_ != (AlphaNum *)local_210)) {
        operator_delete((void *)local_220._0_8_,local_210._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_260) {
        operator_delete(_val,local_260._M_allocated_capacity + 1);
      }
      if (bVar9) {
        bVar9 = SkipFieldValue(this);
        goto LAB_002be7f7;
      }
    }
    bVar9 = SkipFieldMessage(this);
  }
  else {
    if ((field->options_->field_0)._impl_.deprecated_ == true) {
      _val = (pointer)0x27;
      local_268._M_head_impl = (LogMessageData *)0x467ffd;
      local_220._0_8_ = field_name._M_string_length;
      local_220._8_8_ = field_name._M_dataplus._M_p;
      local_60.piece_._M_len = 1;
      local_60.piece_._M_str = "\"";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&full_type_name,(lts_20250127 *)&val,(AlphaNum *)local_220,&local_60,
                 (AlphaNum *)in_R8._M_p);
      message_04._M_str = full_type_name._M_dataplus._M_p;
      message_04._M_len = full_type_name._M_string_length;
      in_R8 = full_type_name._M_dataplus;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_04);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
        operator_delete(full_type_name._M_dataplus._M_p,
                        CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                                 full_type_name.field_2._M_local_buf[0]) + 1);
      }
    }
    pFVar15 = field;
    if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      bVar2 = field->field_0x1;
      bVar7 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar7) {
        pcVar16 = (Nonnull<const_char_*>)0x0;
      }
      else {
        pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                            (bVar7,0xbf < bVar2,
                             "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
      }
      if (pcVar16 != (Nonnull<const_char_*>)0x0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&val,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                   ,0xb54,pcVar16);
        goto LAB_002be9fa;
      }
      if (((pFVar15->field_0x1 & 0x20) == 0) &&
         (bVar7 = Reflection::HasField(local_278,local_280,field), bVar7)) {
        _val = (pointer)0x14;
        local_268._M_head_impl = (LogMessageData *)0x468025;
        local_220._0_8_ = field_name._M_string_length;
        local_220._8_8_ = field_name._M_dataplus._M_p;
        local_60.piece_._M_len = 0x1e;
        local_60.piece_._M_str = "\" is specified multiple times.";
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&full_type_name,(lts_20250127 *)&val,(AlphaNum *)local_220,&local_60,
                   (AlphaNum *)in_R8._M_p);
        message_05._M_str = full_type_name._M_dataplus._M_p;
        message_05._M_len = full_type_name._M_string_length;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_05);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
          local_210._0_8_ =
               CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                        full_type_name.field_2._M_local_buf[0]);
          _Var18 = full_type_name._M_dataplus;
LAB_002be8b5:
          operator_delete(_Var18._M_p,local_210._0_8_ + 1);
        }
      }
      else {
        if ((field->field_0x1 & 0x10) == 0) {
          oneof_descriptor = (OneofDescriptor *)0x0;
        }
        else {
          oneof_descriptor = (field->scope_).containing_oneof;
          if (oneof_descriptor == (OneofDescriptor *)0x0) {
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
        }
        if ((oneof_descriptor == (OneofDescriptor *)0x0) ||
           (bVar7 = Reflection::HasOneof(local_278,local_280,oneof_descriptor), !bVar7))
        goto LAB_002be2c1;
        pFVar15 = Reflection::GetOneofFieldDescriptor(local_278,local_280,oneof_descriptor);
        _val = (pointer)0x7;
        local_268._M_head_impl = (LogMessageData *)0x468059;
        local_220._0_8_ = field_name._M_string_length;
        local_220._8_8_ = field_name._M_dataplus._M_p;
        local_60.piece_._M_len = 0x21;
        local_60.piece_._M_str = "\" is specified along with field \"";
        puVar6 = (ushort *)(pFVar15->all_names_).payload_;
        full_type_name._M_dataplus._M_p = (pointer)(ulong)*puVar6;
        full_type_name._M_string_length = (long)puVar6 + ~(ulong)full_type_name._M_dataplus._M_p;
        prefix._M_dataplus._M_p = (pointer)0x1c;
        prefix._M_string_length = (size_type)anon_var_dwarf_917632;
        puVar6 = (ushort *)(oneof_descriptor->all_names_).payload_;
        serialized_value._M_dataplus._M_p = (pointer)(ulong)*puVar6;
        serialized_value._M_string_length = (long)puVar6 + ~(ulong)serialized_value._M_dataplus._M_p
        ;
        absl::lts_20250127::StrCat<std::basic_string_view<char,std::char_traits<char>>,char[3]>
                  (&prefix_and_full_type_name,(lts_20250127 *)&val,(AlphaNum *)local_220,&local_60,
                   (AlphaNum *)&full_type_name,(AlphaNum *)&prefix,(AlphaNum *)&serialized_value,
                   (basic_string_view<char,_std::char_traits<char>_> *)0x3fa1a3,(char (*) [3])field)
        ;
        message_06._M_str = prefix_and_full_type_name._M_dataplus._M_p;
        message_06._M_len = prefix_and_full_type_name._M_string_length;
        ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_06);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)prefix_and_full_type_name._M_dataplus._M_p != &prefix_and_full_type_name.field_2) {
          local_210._0_8_ =
               CONCAT71(prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_,
                        prefix_and_full_type_name.field_2._M_local_buf[0]);
          _Var18 = prefix_and_full_type_name._M_dataplus;
          goto LAB_002be8b5;
        }
      }
LAB_002be8bd:
      bVar7 = false;
      goto LAB_002be8bf;
    }
LAB_002be2c1:
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
      _val = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
      bVar7 = TryConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_260) {
        operator_delete(_val,local_260._M_allocated_capacity + 1);
      }
      bVar9 = true;
      if ((bVar7) && (TryConsumeWhitespace(this), bVar7)) {
        bVar7 = false;
        if (((field->options_->field_0)._impl_.weak_ == true) &&
           ((this->tokenizer_).current_.type == TYPE_STRING)) {
          local_268._M_head_impl = (LogMessageData *)0x0;
          local_260._M_allocated_capacity = local_260._M_allocated_capacity & 0xffffffffffffff00;
          _val = (pointer)&local_260;
          bVar7 = ConsumeString(this,(string *)&val);
          if (bVar7) {
            pFVar3 = this->finder_;
            if (pFVar3 == (Finder *)0x0) {
              factory = (MessageFactory *)0x0;
            }
            else {
              iVar10 = (*pFVar3->_vptr_Finder[5])(pFVar3,field);
              factory = (MessageFactory *)CONCAT44(extraout_var_02,iVar10);
            }
            this_00 = &Reflection::MutableMessage(local_278,local_280,field,factory)->
                       super_MessageLite;
            data._M_str = _val;
            data._M_len = (size_t)local_268._M_head_impl;
            MessageLite::ParseFromString(this_00,data);
            bVar7 = ConsumeField::anon_class_32_4_2c58ab61::operator()(&skip_parsing,true);
          }
          else {
            bVar7 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_val != &local_260) {
            operator_delete(_val,local_260._M_allocated_capacity + 1);
          }
          bVar9 = false;
        }
      }
      else {
        bVar7 = false;
      }
      if (!bVar9) goto LAB_002be8bf;
    }
    else {
      _val = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
      bVar7 = ConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_260) {
        operator_delete(_val,local_260._M_allocated_capacity + 1);
      }
      if (!bVar7) goto LAB_002be8bd;
      TryConsumeWhitespace(this);
    }
    pFVar15 = field;
    bVar2 = field->field_0x1;
    bVar7 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 == bVar7) {
      pcVar16 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar16 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                          (bVar7,0xbf < bVar2,
                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar16 != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&val,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb54,pcVar16);
LAB_002be9fa:
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&val);
    }
    bVar2 = pFVar15->field_0x1;
    if ((bVar2 & 0x20) == 0) {
      bVar7 = false;
    }
    else {
      _val = (pointer)&local_260;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
      bVar7 = TryConsume(this,(string *)&val);
    }
    if (((bVar2 & 0x20) != 0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_260)) {
      operator_delete(_val,local_260._M_allocated_capacity + 1);
    }
    if (bVar7 == false) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
        bVar7 = ConsumeFieldMessage(this,local_280,local_278,field);
      }
      else {
        bVar7 = ConsumeFieldValue(this,local_280,local_278,field);
      }
      bVar9 = true;
      if (bVar7 == false) goto LAB_002be8bd;
    }
    else {
      local_220._0_8_ = (AlphaNum *)local_210;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"]","");
      bVar7 = TryConsume(this,(string *)local_220);
      if ((AlphaNum *)local_220._0_8_ != (AlphaNum *)local_210) {
        operator_delete((void *)local_220._0_8_,local_210._0_8_ + 1);
      }
      bVar9 = true;
      if (!bVar7) {
        do {
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) == 10) {
            bVar7 = ConsumeFieldMessage(this,local_280,local_278,field);
          }
          else {
            bVar7 = ConsumeFieldValue(this,local_280,local_278,field);
          }
          if (bVar7 == false) goto LAB_002be8bd;
          local_220._0_8_ = (AlphaNum *)local_210;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"]","");
          bVar7 = TryConsume(this,(string *)local_220);
          if ((AlphaNum *)local_220._0_8_ != (AlphaNum *)local_210) {
            operator_delete((void *)local_220._0_8_,local_210._0_8_ + 1);
          }
          if (bVar7) goto LAB_002be7f7;
          local_220._0_8_ = (AlphaNum *)local_210;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_220,",","");
          bVar8 = Consume(this,(string *)local_220);
          if ((AlphaNum *)local_220._0_8_ != (AlphaNum *)local_210) {
            operator_delete((void *)local_220._0_8_,local_210._0_8_ + 1);
          }
          bVar7 = false;
        } while (bVar8);
        goto LAB_002be8bf;
      }
    }
  }
LAB_002be7f7:
  bVar7 = ConsumeField::anon_class_32_4_2c58ab61::operator()(&skip_parsing,bVar9);
LAB_002be8bf:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name._M_dataplus._M_p != &field_name.field_2) {
    operator_delete(field_name._M_dataplus._M_p,
                    CONCAT71(field_name.field_2._M_allocated_capacity._1_7_,
                             field_name.field_2._M_local_buf[0]) + 1);
  }
  return bVar7;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    auto skip_parsing = [&](bool result) {
      // For historical reasons, fields may optionally be separated by commas or
      // semicolons.
      TryConsume(";") || TryConsume(",");

      // If a parse info tree exists, add the location for the parsed
      // field.
      if (parse_info_tree_ != nullptr) {
        int end_line = tokenizer_.previous().line;
        int end_column = tokenizer_.previous().end_column;

        RecordLocation(
            parse_info_tree_, field,
            ParseLocationRange(ParseLocation(start_line, start_column),
                               ParseLocation(end_line, end_column)));
      }

      return result;
    };

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          absl::StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();
      // ':' is optional between message labels and values.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
      }
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError(absl::StrCat("Could not find type \"",
                                 prefix_and_full_type_name,
                                 "\" stored in google.protobuf.Any."));
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::move(prefix_and_full_type_name));
      reflection->SetString(message, any_value_field,
                            std::move(serialized_value));
      return skip_parsing(true);
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError(absl::StrCat("Extension \"", field_name,
                                   "\" is not defined or "
                                   "is not an extension of \"",
                                   descriptor->full_name(), "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat(
              "Ignoring extension \"", field_name,
              "\" which is not defined or is not an extension of \"",
              descriptor->full_name(), "\"."));
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace();

      int32_t field_number;
      if (allow_field_number_ && absl::SimpleAtoi(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group-like delimited fields will accept both the capitalized type
        // names as well.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr && !internal::cpp::IsGroupLike(*field)) {
            field = nullptr;
          }
          if (field != nullptr && field->message_type()->name() != field_name) {
            field = nullptr;
          }
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }
      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError(absl::StrCat("Message type \"", descriptor->full_name(),
                                   "\" has no field named \"", field_name,
                                   "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat("Message type \"", descriptor->full_name(),
                                     "\" has no field named \"", field_name,
                                     "\"."));
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      ABSL_CHECK(allow_unknown_field_ || allow_unknown_extension_ ||
                 reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
        if (!LookingAt("{") && !LookingAt("<")) {
          return skip_parsing(SkipFieldValue());
        }
      }
      return skip_parsing(SkipFieldMessage());
    }

    if (field->options().deprecated()) {
      ReportWarning(absl::StrCat("text format contains deprecated field \"",
                                 field_name, "\""));
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError(absl::StrCat("Non-repeated field \"", field_name,
                                 "\" is specified multiple times."));
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError(absl::StrCat("Field \"", field_name,
                                 "\" is specified along with "
                                 "field \"",
                                 other_field->name(),
                                 "\", another member "
                                 "of oneof \"",
                                 oneof->name(), "\"."));
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      if (consumed_semicolon) {
        TryConsumeWhitespace();
      }
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        return skip_parsing(true);
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace();
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }

    return skip_parsing(true);
  }